

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<3,_2,_5,_0,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float afStack_3c [5];
  undefined4 local_28;
  float fStack_24;
  undefined4 uStack_20;
  float fStack_1c;
  int aiStack_18 [6];
  
  auVar2 = divps(*(undefined1 (*) [16])evalCtx->in[0].m_data,_DAT_0223f920);
  auVar3._8_4_ = DAT_0223f920._8_4_;
  auVar3._0_8_ = DAT_0223f920._8_8_;
  auVar3._12_4_ = DAT_0223f920._12_4_;
  auVar3 = divps(*(undefined1 (*) [16])evalCtx->in[1].m_data,auVar3);
  uStack_20 = auVar3._0_4_;
  fStack_24 = auVar2._4_4_;
  fStack_1c = auVar3._4_4_;
  local_28 = auVar2._0_4_;
  afStack_3c[2] = (float)local_28;
  afStack_3c[3] = (float)uStack_20;
  afStack_3c[4] = fStack_24 + fStack_1c;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_3c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}